

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Window_Type.cxx
# Opt level: O1

void __thiscall Fl_Window_Type::draw_overlay(Fl_Window_Type *this)

{
  Fl_Widget *pFVar1;
  Fl_Type *pFVar2;
  Fl_Widget_Type *pFVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  int iVar7;
  uint uVar8;
  long lVar9;
  uint uVar10;
  long lVar11;
  Fl_Widget_Type *pFVar12;
  Fl_Widget_Type *myo;
  Fl_Widget_Type *pFVar13;
  uint uVar14;
  uint uVar15;
  Fl_Type *pFVar16;
  ulong uVar17;
  uint uVar18;
  int t;
  int y;
  int x;
  int r;
  int hh;
  int ww;
  int ih;
  int iw;
  ulong local_c0;
  uint local_ac;
  uint local_a8;
  uint local_a4;
  ulong local_a0;
  int local_98;
  uint local_94;
  ulong local_90;
  uint local_84;
  uint local_80;
  uint local_7c;
  int local_78;
  uint local_74;
  uint local_70;
  int local_6c;
  Fl_Widget_Type *local_68;
  ulong local_60;
  int local_58;
  uint local_54;
  ulong local_50;
  ulong local_48;
  uint local_3c;
  int local_38;
  int local_34;
  
  if (this->recalc != 0) {
    pFVar16 = (this->super_Fl_Widget_Type).super_Fl_Type.next;
    pFVar1 = (this->super_Fl_Widget_Type).o;
    this->bx = pFVar1->w_;
    this->by = pFVar1->h_;
    this->br = 0;
    this->bt = 0;
    this->numselected = 0;
    for (; (pFVar16 != (Fl_Type *)0x0 &&
           ((this->super_Fl_Widget_Type).super_Fl_Type.level < pFVar16->level));
        pFVar16 = pFVar16->next) {
      if ((pFVar16->selected != '\0') &&
         ((iVar4 = (*pFVar16->_vptr_Fl_Type[0x17])(pFVar16), iVar4 != 0 &&
          (iVar4 = (*pFVar16->_vptr_Fl_Type[0x1e])(pFVar16), iVar4 == 0)))) {
        this->numselected = this->numselected + 1;
        pFVar2 = pFVar16[1].prev;
        iVar4 = *(int *)&pFVar2->user_data_;
        if (iVar4 < this->bx) {
          this->bx = iVar4;
        }
        iVar7 = *(int *)((long)&pFVar2->user_data_ + 4);
        if (iVar7 < this->by) {
          this->by = iVar7;
        }
        iVar4 = iVar4 + *(int *)&pFVar2->user_data_type_;
        if (this->br < iVar4) {
          this->br = iVar4;
        }
        iVar7 = iVar7 + *(int *)((long)&pFVar2->user_data_type_ + 4);
        if (this->bt < iVar7) {
          this->bt = iVar7;
        }
      }
    }
    this->recalc = 0;
    this->sx = this->bx;
    this->sy = this->by;
    this->sr = this->br;
    this->st = this->bt;
  }
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,0x58);
  if (this->drag == 0x20) {
    uVar18 = this->mx;
    uVar15 = this->x1;
    if ((uVar15 != uVar18) || (this->y1 != this->my)) {
      uVar5 = uVar18;
      if ((int)uVar15 < (int)uVar18) {
        uVar5 = uVar15;
      }
      uVar10 = this->y1;
      uVar8 = this->my;
      uVar14 = uVar8;
      if ((int)uVar10 < (int)uVar8) {
        uVar14 = uVar10;
      }
      lVar6 = (long)(int)uVar15 - (long)(int)uVar18;
      lVar9 = -lVar6;
      if (0 < lVar6) {
        lVar9 = lVar6;
      }
      lVar11 = (long)(int)uVar10 - (long)(int)uVar8;
      lVar6 = -lVar11;
      if (0 < lVar11) {
        lVar6 = lVar11;
      }
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[3])
                (fl_graphics_driver,(ulong)uVar5,(ulong)uVar14,lVar9,lVar6);
    }
  }
  if ((overlays_invisible == 0) || (this->drag != 0)) {
    if ((this->super_Fl_Widget_Type).super_Fl_Type.selected != '\0') {
      pFVar1 = (this->super_Fl_Widget_Type).o;
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[3])
                (fl_graphics_driver,0,0,(ulong)(uint)pFVar1->w_,(ulong)(uint)pFVar1->h_);
    }
    if (this->numselected != 0) {
      pFVar13 = (Fl_Widget_Type *)(this->super_Fl_Widget_Type).super_Fl_Type.next;
      pFVar1 = (this->super_Fl_Widget_Type).o;
      local_7c = pFVar1->w_;
      local_60 = (ulong)local_7c;
      uVar18 = pFVar1->h_;
      local_54 = uVar18;
      if (pFVar13 == (Fl_Widget_Type *)0x0) {
        local_48 = 0;
        local_70 = 0;
        local_68 = (Fl_Widget_Type *)0x0;
        uVar15 = 0;
        uVar17 = 0;
        local_60 = (ulong)local_7c;
      }
      else {
        uVar17 = 0;
        uVar15 = 0;
        local_68 = (Fl_Widget_Type *)0x0;
        local_70 = 0;
        local_48 = 0;
        do {
          if ((pFVar13->super_Fl_Type).level <= (this->super_Fl_Widget_Type).super_Fl_Type.level)
          break;
          if ((((pFVar13->super_Fl_Type).selected != '\0') &&
              (iVar4 = (*(pFVar13->super_Fl_Type)._vptr_Fl_Type[0x17])(pFVar13), iVar4 != 0)) &&
             (iVar4 = (*(pFVar13->super_Fl_Type)._vptr_Fl_Type[0x1e])(pFVar13), uVar5 = local_54,
             iVar4 == 0)) {
            local_84 = uVar18;
            local_74 = uVar15;
            local_50 = uVar17;
            newposition(this,pFVar13,(int *)&local_a4,(int *)&local_a8,(int *)&local_94,
                        (int *)&local_ac);
            if (((show_guides == 0) || (this->drag == 0)) || (this->numselected != 1)) {
              (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[3])();
            }
            uVar8 = local_94;
            uVar10 = local_a4;
            uVar15 = local_a8;
            uVar18 = local_ac;
            if ((int)local_a4 < (int)local_7c) {
              local_7c = local_a4;
            }
            local_54 = uVar5;
            if ((int)local_a8 < (int)uVar5) {
              local_54 = local_a8;
            }
            iVar4 = (int)local_48;
            local_48 = local_48 & 0xffffffff;
            if (iVar4 < (int)local_94) {
              local_48 = (ulong)local_94;
            }
            if ((int)local_70 < (int)local_ac) {
              local_70 = local_ac;
            }
            pFVar1 = pFVar13->o;
            uVar5 = (pFVar1->label_).align_;
            if ((uVar5 & 0x10) == 0) {
              local_6c = 0;
              if ((char)uVar5 < '\0') {
                local_6c = pFVar1->w_;
              }
              local_78 = (pFVar1->label_).size;
              Fl_Label::measure(&pFVar1->label_,&local_6c,&local_78);
              uVar5 = (pFVar13->o->label_).align_;
              if ((uVar5 & 1) == 0) {
                if ((uVar5 & 2) == 0) {
                  if ((uVar5 & 4) == 0) {
                    if ((uVar5 & 8) != 0) {
                      local_94 = local_6c + uVar8 + 4;
                    }
                  }
                  else {
                    local_a4 = (uVar10 - local_6c) - 4;
                  }
                }
                else {
                  local_ac = uVar18 + local_78;
                }
              }
              else {
                local_a8 = uVar15 - local_78;
              }
            }
            iVar4 = (int)local_60;
            local_60 = local_60 & 0xffffffff;
            if ((int)local_a4 < iVar4) {
              local_60 = (ulong)local_a4;
            }
            uVar18 = local_84;
            if ((int)local_a8 < (int)local_84) {
              uVar18 = local_a8;
            }
            uVar17 = local_50 & 0xffffffff;
            if ((int)local_50 < (int)local_94) {
              uVar17 = (ulong)local_94;
            }
            uVar15 = local_74;
            local_68 = pFVar13;
            if ((int)local_74 < (int)local_ac) {
              uVar15 = local_ac;
            }
          }
          pFVar13 = (Fl_Widget_Type *)(pFVar13->super_Fl_Type).next;
        } while (pFVar13 != (Fl_Widget_Type *)0x0);
      }
      if ((this->super_Fl_Widget_Type).super_Fl_Type.selected == '\0') {
        local_74 = uVar15;
        local_50 = uVar17;
        if ((show_guides == 0) || (this->drag == 0)) {
          iVar4 = (int)local_48;
          uVar15 = local_70;
          uVar5 = local_54;
          local_84 = uVar18;
        }
        else {
          (*(this->super_Fl_Widget_Type).super_Fl_Type._vptr_Fl_Type[0x2e])
                    (this,&local_a4,&local_a8);
          local_c0 = local_60;
          uVar15 = local_a8;
          local_a0 = (ulong)local_74;
          uVar17 = local_50 & 0xffffffff;
          uVar10 = uVar18;
          if (this->drag != 0) {
            uVar8 = uVar18 - local_a8;
            uVar5 = -uVar8;
            if (0 < (int)uVar8) {
              uVar5 = uVar8;
            }
            uVar14 = local_74;
            if (uVar5 < 3) {
              this->dy = this->dy - uVar8;
              uVar14 = local_74 - ((this->drag << 0x1b) >> 0x1f & uVar8);
              draw_v_arrow((int)local_60 + 5,local_a8,0);
              uVar10 = uVar15;
            }
            local_a0 = (ulong)uVar14;
            iVar4 = ((this->super_Fl_Widget_Type).o)->h_;
            uVar5 = iVar4 - (local_a8 + uVar14);
            uVar15 = -uVar5;
            if (0 < (int)uVar5) {
              uVar15 = uVar5;
            }
            if (uVar15 < 3) {
              this->dy = this->dy + uVar5;
              uVar10 = ((this->drag << 0x1b) >> 0x1f & uVar5) + uVar10;
              local_a0 = (ulong)(uVar14 + uVar5);
              draw_v_arrow((int)local_60 + 5,uVar14 + uVar5,iVar4);
              local_c0 = local_60;
            }
            uVar5 = local_a4;
            uVar8 = (int)local_c0 - local_a4;
            uVar15 = -uVar8;
            if (0 < (int)uVar8) {
              uVar15 = uVar8;
            }
            uVar17 = local_50 & 0xffffffff;
            local_60 = local_c0;
            if (uVar15 < 3) {
              this->dx = this->dx - uVar8;
              uVar17 = (ulong)((int)local_50 - ((this->drag << 0x1b) >> 0x1f & uVar8));
              draw_h_arrow(local_a4,uVar10 + 5,0);
              local_c0 = (ulong)uVar5;
            }
            iVar4 = ((this->super_Fl_Widget_Type).o)->w_;
            uVar5 = iVar4 - (local_a4 + (int)uVar17);
            uVar15 = -uVar5;
            if (0 < (int)uVar5) {
              uVar15 = uVar5;
            }
            if (uVar15 < 3) {
              this->dx = this->dx + uVar5;
              iVar7 = this->drag;
              uVar15 = (int)uVar17 + uVar5;
              uVar17 = (ulong)uVar15;
              draw_h_arrow(uVar15,uVar10 + 5,iVar4);
              local_c0 = (ulong)(((iVar7 << 0x1b) >> 0x1f & uVar5) + (int)local_c0);
            }
          }
          pFVar13 = local_68;
          local_90 = uVar17;
          if (((this->numselected == 1) && (local_68 != (Fl_Widget_Type *)0x0)) &&
             ((this->drag & 0x10) == 0)) {
            newposition(this,local_68,(int *)&local_94,(int *)&local_ac,&local_6c,&local_78);
            iVar7 = local_6c - local_94;
            iVar4 = local_78 - local_ac;
            local_38 = iVar4;
            local_34 = iVar7;
            (*(pFVar13->super_Fl_Type)._vptr_Fl_Type[0x2d])(pFVar13);
            if ((this->drag & 0xcU) != 0) {
              uVar5 = local_38 - iVar4;
              uVar15 = -uVar5;
              if (0 < (int)uVar5) {
                uVar15 = uVar5;
              }
              if (uVar15 < 5) {
                if ((this->drag & 8U) == 0) {
                  local_78 = local_78 + uVar5;
                  local_a0 = (ulong)((int)local_a0 + uVar5);
                  iVar4 = uVar5 + this->dy;
                }
                else {
                  local_ac = local_ac - uVar5;
                  uVar10 = uVar10 - uVar5;
                  iVar4 = this->dy - uVar5;
                }
                this->dy = iVar4;
              }
              iVar4 = local_94 + 10;
              if (0x31 < (int)local_94) {
                iVar4 = local_94 - 10;
              }
              draw_height(iVar4,local_ac,local_78,(uint)((int)local_94 < 0x32) * 4 + 4);
            }
            if ((this->drag & 3U) != 0) {
              uVar5 = local_34 - iVar7;
              uVar15 = -uVar5;
              if (0 < (int)uVar5) {
                uVar15 = uVar5;
              }
              if (uVar15 < 5) {
                if ((this->drag & 1U) == 0) {
                  local_6c = local_6c + uVar5;
                  local_90 = (ulong)((int)local_90 + uVar5);
                  iVar4 = uVar5 + this->dx;
                }
                else {
                  local_94 = local_94 - uVar5;
                  local_c0 = (ulong)((int)local_c0 - uVar5);
                  iVar4 = this->dx - uVar5;
                }
                this->dx = iVar4;
              }
              iVar4 = local_ac + 10;
              if (0x31 < (int)local_ac) {
                iVar4 = local_ac - 10;
              }
              draw_width(local_94,iVar4,local_6c,((int)local_ac < 0x32) + 1);
            }
          }
          pFVar12 = local_68;
          if ((this->drag != 0) &&
             (iVar4 = (*(pFVar13->super_Fl_Type)._vptr_Fl_Type[0x17])(pFVar13), pFVar12 = local_68,
             iVar4 != 0)) {
            local_84 = uVar18;
            local_68 = pFVar13;
            for (pFVar3 = (Fl_Widget_Type *)(this->super_Fl_Widget_Type).super_Fl_Type.next;
                (pFVar3 != (Fl_Widget_Type *)0x0 &&
                (pFVar12 = local_68,
                (this->super_Fl_Widget_Type).super_Fl_Type.level < (pFVar3->super_Fl_Type).level));
                pFVar3 = (Fl_Widget_Type *)(pFVar3->super_Fl_Type).next) {
              uVar17 = local_a0;
              if ((pFVar3 != pFVar13) &&
                 ((iVar4 = (*(pFVar3->super_Fl_Type)._vptr_Fl_Type[0x17])(pFVar3), uVar17 = local_a0
                  , iVar4 != 0 &&
                  (iVar4 = Fl_Widget::visible_r(pFVar3->o), uVar17 = local_a0, iVar4 != 0)))) {
                pFVar1 = pFVar3->o;
                local_58 = pFVar1->x_;
                iVar4 = pFVar1->y_;
                uVar15 = pFVar1->w_;
                uVar5 = pFVar1->h_ + iVar4;
                if (((pFVar1->label_).align_ & 0x10) == 0) {
                  local_ac = (pFVar1->label_).size;
                  local_94 = uVar15;
                  Fl_Label::measure(&pFVar1->label_,(int *)&local_94,(int *)&local_ac);
                  uVar18 = (pFVar3->o->label_).align_;
                  iVar4 = iVar4 - (-(uVar18 & 1) & local_ac);
                  uVar5 = uVar5 + ((int)(uVar18 << 0x1e) >> 0x1f & local_ac);
                  pFVar13 = local_68;
                  uVar18 = local_84;
                }
                local_80 = uVar15 + local_58;
                iVar7 = pFVar13->o->y_;
                uVar8 = iVar4 - (pFVar13->o->h_ + iVar7);
                uVar15 = -uVar8;
                if (0 < (int)uVar8) {
                  uVar15 = uVar8;
                }
                uVar14 = iVar7 - uVar5;
                uVar8 = -uVar14;
                if (0 < (int)uVar14) {
                  uVar8 = uVar14;
                }
                if ((int)uVar15 < (int)uVar8) {
                  uVar8 = uVar15;
                }
                local_98 = iVar4;
                if (uVar8 < 0x19) {
                  if ((this->drag & 0x11U) != 0) {
                    uVar8 = (int)local_c0 - local_58;
                    uVar15 = -uVar8;
                    if (0 < (int)uVar8) {
                      uVar15 = uVar8;
                    }
                    if (uVar15 < 3) {
                      this->dx = this->dx + uVar8;
                      local_c0 = (ulong)((int)local_c0 + uVar8);
                      local_90 = (ulong)((int)local_90 + ((this->drag << 0x1b) >> 0x1f & uVar8));
                      draw_left_brace(pFVar3->o);
                    }
                  }
                  if ((this->drag & 0x12U) != 0) {
                    uVar8 = local_80 - (int)local_90;
                    uVar15 = -uVar8;
                    if (0 < (int)uVar8) {
                      uVar15 = uVar8;
                    }
                    if (uVar15 < 3) {
                      this->dx = this->dx + uVar8;
                      local_c0 = (ulong)((int)local_c0 + ((this->drag << 0x1b) >> 0x1f & uVar8));
                      draw_right_brace(pFVar3->o);
                      local_90 = (ulong)local_80;
                    }
                  }
                }
                if ((this->drag & 0x18U) != 0) {
                  uVar8 = uVar10 - local_98;
                  uVar15 = -uVar8;
                  if (0 < (int)uVar8) {
                    uVar15 = uVar8;
                  }
                  if (uVar15 < 3) {
                    this->dy = this->dy + uVar8;
                    uVar10 = uVar10 + uVar8;
                    local_a0 = (ulong)((int)local_a0 + ((this->drag << 0x1b) >> 0x1f & uVar8));
                    pFVar1 = pFVar3->o;
                    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[9])
                              (fl_graphics_driver,(ulong)(uint)pFVar1->x_,(ulong)(pFVar1->y_ - 2),
                               (ulong)(pFVar1->y_ + 6));
                    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[9])
                              (fl_graphics_driver,(ulong)((pFVar1->x_ + pFVar1->w_) - 1),
                               (ulong)(pFVar1->y_ - 2),(ulong)(pFVar1->y_ + 6));
                    pFVar13 = local_68;
                    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[6])
                              (fl_graphics_driver,(ulong)(pFVar1->x_ - 2),(ulong)(uint)pFVar1->y_,
                               (ulong)(pFVar1->w_ + pFVar1->x_ + 1));
                  }
                }
                if ((this->drag & 0x14U) != 0) {
                  uVar8 = uVar5 - (int)local_a0;
                  uVar15 = -uVar8;
                  if (0 < (int)uVar8) {
                    uVar15 = uVar8;
                  }
                  if (uVar15 < 3) {
                    this->dy = this->dy + uVar8;
                    uVar10 = uVar10 + ((this->drag << 0x1b) >> 0x1f & uVar8);
                    pFVar1 = pFVar3->o;
                    iVar4 = pFVar1->y_;
                    iVar7 = pFVar1->h_;
                    local_a0 = CONCAT44(local_a0._4_4_,iVar7 + -1 + iVar4);
                    uVar15 = iVar7 + -7 + iVar4;
                    local_3c = iVar7 + 1 + iVar4;
                    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[9])
                              (fl_graphics_driver,(ulong)(uint)pFVar1->x_,(ulong)uVar15);
                    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[9])
                              (fl_graphics_driver,(ulong)((pFVar1->x_ + pFVar1->w_) - 1),
                               (ulong)uVar15,(ulong)local_3c);
                    pFVar13 = local_68;
                    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[6])
                              (fl_graphics_driver,(ulong)(pFVar1->x_ - 2),local_a0 & 0xffffffff,
                               (ulong)(pFVar1->w_ + pFVar1->x_ + 1));
                    local_a0 = (ulong)uVar5;
                  }
                }
                iVar4 = (*(pFVar13->super_Fl_Type)._vptr_Fl_Type[0x20])(pFVar13);
                pFVar12 = pFVar13;
                if (iVar4 == 0) {
                  pFVar12 = pFVar3;
                }
                (*(pFVar12->super_Fl_Type)._vptr_Fl_Type[0x2e])(pFVar12,&local_a4,&local_a8);
                if (((int)uVar10 <= (int)uVar5) && (local_98 <= (int)local_a0)) {
                  if ((this->drag & 0x11U) != 0) {
                    uVar8 = (local_58 - (int)local_c0) - local_a4;
                    uVar15 = -uVar8;
                    if (0 < (int)uVar8) {
                      uVar15 = uVar8;
                    }
                    uVar14 = (local_58 - (int)local_c0) + local_a4;
                    if (uVar15 < 3) {
                      uVar14 = uVar8;
                    }
                    uVar15 = -uVar14;
                    if (0 < (int)uVar14) {
                      uVar15 = uVar14;
                    }
                    if (uVar15 < 3) {
                      this->dx = this->dx + uVar14;
                      uVar15 = (int)local_c0 + uVar14;
                      local_c0 = (ulong)uVar15;
                      local_90 = (ulong)((int)local_90 + ((this->drag << 0x1b) >> 0x1f & uVar14));
                      draw_h_arrow(uVar15,(int)(uVar10 + (int)local_a0) / 2,local_58);
                    }
                    uVar8 = (local_80 - (int)local_c0) - local_a4;
                    uVar15 = -uVar8;
                    if (0 < (int)uVar8) {
                      uVar15 = uVar8;
                    }
                    uVar14 = (local_80 - (int)local_c0) + local_a4;
                    if (uVar15 < 3) {
                      uVar14 = uVar8;
                    }
                    uVar15 = -uVar14;
                    if (0 < (int)uVar14) {
                      uVar15 = uVar14;
                    }
                    if (uVar15 < 3) {
                      this->dx = this->dx + uVar14;
                      uVar15 = (int)local_c0 + uVar14;
                      local_c0 = (ulong)uVar15;
                      local_90 = (ulong)((int)local_90 + ((this->drag << 0x1b) >> 0x1f & uVar14));
                      draw_h_arrow(uVar15,(int)(uVar10 + (int)local_a0) / 2,local_80);
                    }
                  }
                  if ((this->drag & 0x12U) != 0) {
                    iVar4 = local_58 - (int)local_90;
                    uVar8 = iVar4 - local_a4;
                    uVar15 = -uVar8;
                    if (0 < (int)uVar8) {
                      uVar15 = uVar8;
                    }
                    uVar14 = iVar4 + local_a4;
                    if (uVar15 < 3) {
                      uVar14 = uVar8;
                    }
                    uVar15 = -uVar14;
                    if (0 < (int)uVar14) {
                      uVar15 = uVar14;
                    }
                    uVar17 = local_90;
                    if (uVar15 < 3) {
                      this->dx = this->dx + uVar14;
                      local_c0 = (ulong)((int)local_c0 + ((this->drag << 0x1b) >> 0x1f & uVar14));
                      uVar14 = (int)local_90 + uVar14;
                      uVar17 = (ulong)uVar14;
                      draw_h_arrow(uVar14,(int)(uVar10 + (int)local_a0) / 2,local_58);
                    }
                    iVar4 = local_80 - (int)uVar17;
                    uVar15 = local_a4 + iVar4;
                    uVar8 = -uVar15;
                    if (0 < (int)uVar15) {
                      uVar8 = uVar15;
                    }
                    uVar14 = iVar4 - local_a4;
                    if (uVar8 < 3) {
                      uVar14 = uVar15;
                    }
                    uVar15 = -uVar14;
                    if (0 < (int)uVar14) {
                      uVar15 = uVar14;
                    }
                    local_90 = uVar17;
                    if (uVar15 < 3) {
                      this->dx = this->dx + uVar14;
                      local_c0 = (ulong)((int)local_c0 + ((this->drag << 0x1b) >> 0x1f & uVar14));
                      uVar14 = (int)uVar17 + uVar14;
                      local_90 = (ulong)uVar14;
                      draw_h_arrow(uVar14,(int)(uVar10 + (int)local_a0) / 2,local_80);
                    }
                  }
                }
                uVar17 = local_a0;
                if (((int)local_c0 <= (int)local_80) && (local_58 <= (int)local_90)) {
                  if ((this->drag & 0x18U) != 0) {
                    uVar15 = (local_98 - uVar10) - local_a8;
                    uVar18 = -uVar15;
                    if (0 < (int)uVar15) {
                      uVar18 = uVar15;
                    }
                    uVar8 = (local_98 - uVar10) + local_a8;
                    if (uVar18 < 3) {
                      uVar8 = uVar15;
                    }
                    uVar18 = -uVar8;
                    if (0 < (int)uVar8) {
                      uVar18 = uVar8;
                    }
                    if (uVar18 < 3) {
                      this->dy = this->dy + uVar8;
                      uVar10 = uVar10 + uVar8;
                      uVar18 = ((this->drag << 0x1b) >> 0x1f & uVar8) + (int)local_a0;
                      draw_v_arrow(((int)local_90 + (int)local_c0) / 2,uVar10,local_98);
                      local_a0 = (ulong)uVar18;
                    }
                    uVar15 = (uVar5 - uVar10) - local_a8;
                    uVar18 = -uVar15;
                    if (0 < (int)uVar15) {
                      uVar18 = uVar15;
                    }
                    uVar8 = (uVar5 - uVar10) + local_a8;
                    if (uVar18 < 3) {
                      uVar8 = uVar15;
                    }
                    uVar18 = -uVar8;
                    if (0 < (int)uVar8) {
                      uVar18 = uVar8;
                    }
                    uVar17 = local_a0;
                    if (uVar18 < 3) {
                      this->dy = this->dy + uVar8;
                      uVar10 = uVar10 + uVar8;
                      uVar18 = ((this->drag << 0x1b) >> 0x1f & uVar8) + (int)local_a0;
                      draw_v_arrow(((int)local_90 + (int)local_c0) / 2,uVar10,uVar5);
                      uVar17 = (ulong)uVar18;
                    }
                  }
                  pFVar13 = local_68;
                  uVar18 = local_84;
                  if ((this->drag & 0x14U) != 0) {
                    iVar4 = local_98 - (int)uVar17;
                    uVar15 = iVar4 - local_a8;
                    uVar18 = -uVar15;
                    if (0 < (int)uVar15) {
                      uVar18 = uVar15;
                    }
                    uVar8 = iVar4 + local_a8;
                    if (uVar18 < 3) {
                      uVar8 = uVar15;
                    }
                    uVar18 = -uVar8;
                    if (0 < (int)uVar8) {
                      uVar18 = uVar8;
                    }
                    if (uVar18 < 3) {
                      this->dy = this->dy + uVar8;
                      uVar10 = ((this->drag << 0x1b) >> 0x1f & uVar8) + uVar10;
                      uVar8 = (int)uVar17 + uVar8;
                      uVar17 = (ulong)uVar8;
                      draw_v_arrow(((int)local_90 + (int)local_c0) / 2,uVar8,local_98);
                    }
                    uVar18 = local_84;
                    iVar4 = uVar5 - (int)uVar17;
                    uVar8 = iVar4 - local_a8;
                    uVar15 = -uVar8;
                    if (0 < (int)uVar8) {
                      uVar15 = uVar8;
                    }
                    uVar14 = iVar4 + local_a8;
                    if (uVar15 < 3) {
                      uVar14 = uVar8;
                    }
                    uVar15 = -uVar14;
                    if (0 < (int)uVar14) {
                      uVar15 = uVar14;
                    }
                    pFVar13 = local_68;
                    if (uVar15 < 3) {
                      this->dy = this->dy + uVar14;
                      uVar10 = ((this->drag << 0x1b) >> 0x1f & uVar14) + uVar10;
                      uVar14 = (int)uVar17 + uVar14;
                      local_a0 = (ulong)uVar14;
                      draw_v_arrow(((int)local_90 + (int)local_c0) / 2,uVar14,uVar5);
                      pFVar13 = local_68;
                      uVar17 = local_a0;
                    }
                  }
                }
              }
              local_a0 = uVar17;
              pFVar12 = local_68;
            }
          }
          local_68 = pFVar12;
          local_7c = (local_7c - (int)local_60) + (int)local_c0;
          iVar4 = ((int)local_48 - (int)local_50) + (int)local_90;
          local_60 = local_c0;
          uVar15 = (local_70 - local_74) + (int)local_a0;
          uVar5 = (local_54 - uVar18) + uVar10;
          local_84 = uVar10;
        }
        this->sx = local_7c;
        this->sy = uVar5;
        this->sr = iVar4;
        this->st = uVar15;
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[5])(fl_graphics_driver,2,0,0);
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[3])();
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[5])(fl_graphics_driver,0,0,0);
        uVar18 = local_7c;
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[3])
                  (fl_graphics_driver,(ulong)local_7c,(ulong)uVar5,(ulong)(iVar4 - local_7c),
                   (ulong)(uVar15 - uVar5));
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[4])
                  (fl_graphics_driver,(ulong)uVar18,(ulong)uVar5,5,5);
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[4])
                  (fl_graphics_driver,(ulong)(iVar4 - 5U),(ulong)uVar5,5,5);
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[4])
                  (fl_graphics_driver,(ulong)(iVar4 - 5U),(ulong)(uVar15 - 5),5,5);
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[4])
                  (fl_graphics_driver,(ulong)uVar18,(ulong)(uVar15 - 5),5,5);
      }
    }
  }
  return;
}

Assistant:

void Fl_Window_Type::draw_overlay() {
  if (recalc) {
    bx = o->w(); by = o->h(); br = 0; bt = 0;
    numselected = 0;
    for (Fl_Type *q=next; q && q->level>level; q=q->next)
      if (q->selected && q->is_widget() && !q->is_menu_item()) {
	numselected++;
	Fl_Widget_Type* myo = (Fl_Widget_Type*)q;
	if (myo->o->x() < bx) bx = myo->o->x();
	if (myo->o->y() < by) by = myo->o->y();
	if (myo->o->x()+myo->o->w() > br) br = myo->o->x()+myo->o->w();
	if (myo->o->y()+myo->o->h() > bt) bt = myo->o->y()+myo->o->h();
      }
    recalc = 0;
    sx = bx; sy = by; sr = br; st = bt;
  }
  fl_color(FL_RED);
  if (drag==BOX && (x1 != mx || y1 != my)) {
    int x = x1; int r = mx; if (x > r) {x = mx; r = x1;}
    int y = y1; int b = my; if (y > b) {y = my; b = y1;}
    fl_rect(x,y,r-x,b-y);
  }
  if (overlays_invisible && !drag) return;
  if (selected) fl_rect(0,0,o->w(),o->h());
  if (!numselected) return;
  int mybx,myby,mybr,mybt;
  int mysx,mysy,mysr,myst;
  mybx = mysx = o->w(); myby = mysy = o->h(); mybr = mysr = 0; mybt = myst = 0;
  Fl_Type *selection = 0L; // used to store the one selected widget (if n==1)
  for (Fl_Type *q=next; q && q->level>level; q = q->next)
    if (q->selected && q->is_widget() && !q->is_menu_item()) {
      selection = q;
      Fl_Widget_Type* myo = (Fl_Widget_Type*)q;
      int x,y,r,t;
      newposition(myo,x,y,r,t);
      if (!show_guides || !drag || numselected != 1) fl_rect(x,y,r-x,t-y);
      if (x < mysx) mysx = x;
      if (y < mysy) mysy = y;
      if (r > mysr) mysr = r;
      if (t > myst) myst = t;
      if (!(myo->o->align() & FL_ALIGN_INSIDE)) {
        // Adjust left/right/top/bottom for top/bottom labels...
	int ww, hh;
	ww = (myo->o->align() & FL_ALIGN_WRAP) ? myo->o->w() : 0;
	hh = myo->o->labelsize();
	myo->o->measure_label(ww, hh);
	if (myo->o->align() & FL_ALIGN_TOP) y -= hh;
	else if (myo->o->align() & FL_ALIGN_BOTTOM) t += hh;
	else if (myo->o->align() & FL_ALIGN_LEFT) x -= ww + 4;
	else if (myo->o->align() & FL_ALIGN_RIGHT) r += ww + 4;
      }
      if (x < mybx) mybx = x;
      if (y < myby) myby = y;
      if (r > mybr) mybr = r;
      if (t > mybt) mybt = t;
    }
  if (selected) return;

  if (show_guides && drag) {
    // draw overlays for UI Guideline distances
    // - check for distance to the window edge
    //    * FLTK suggests 10 pixels from the edge
    int d;
    int xsp, ysp;
    int mybx_bak = mybx, myby_bak = myby, mybr_bak = mybr, mybt_bak = mybt;
    Fl_Widget_Type *mysel = (Fl_Widget_Type *)selection;


    ideal_spacing(xsp, ysp);

    if (drag) {
      // Check top spacing...
      if (abs(d = myby - ysp) < 3) {
	dy -= d;
	if (drag & DRAG) mybt -= d;
	myby -= d;
	draw_v_arrow(mybx+5, myby, 0);
      }

      // Check bottom spacing...
      if (abs(d = o->h() - mybt - ysp) < 3) {
	dy += d;
	if (drag & DRAG) myby += d;
	mybt += d;
	draw_v_arrow(mybx+5, mybt, o->h());
      }

      // Check left spacing...
      if (abs(d = mybx - xsp) < 3) {
        dx -= d;
	if (drag & DRAG) mybr -= d;
	mybx -= d;
	draw_h_arrow(mybx, myby+5, 0);
      }

      // Check right spacing...
      if (abs(d = o->w() - mybr - xsp) < 3) {
	dx += d;
	if (drag & DRAG) mybx += d;
	mybr += d;
	draw_h_arrow(mybr, myby+5, o->w());
      }
    }

    if (numselected==1 && selection && !(drag & DRAG)) {
      // Check ideal sizes
      int x,y,r,t;
      newposition(mysel,x,y,r,t);
      int w = r-x;
      int h = t-y;
      int iw = w, ih = h;

      mysel->ideal_size(iw, ih);

      if (drag & (TOP | BOTTOM)) {
	// Check height
	if (abs(d = ih - h) < 5) {
          // Resize height
	  if (drag & TOP) {
	    myby -= d;
	    y -= d;
	    dy -= d;
	  } else {
	    mybt += d;
	    t += d;
	    dy += d;
	  }
	}

	// Draw height guide
	draw_height(x < 50 ? x+10 : x-10, y, t,
	            x < 50 ? FL_ALIGN_RIGHT : FL_ALIGN_LEFT);
      }

      if (drag & (LEFT | RIGHT)) {
	// Check width
	if (abs(d = iw - w) < 5) {
          // Resize width
          if (drag & LEFT) {
	    mybx -= d;
	    x -= d;
	    dx -= d;
	  } else {
	    mybr += d;
	    r += d;
	    dx += d;
	  }
	}

	// Draw width guide
	draw_width(x, y < 50 ? y+10 : y-10, r,
	           y < 50 ? FL_ALIGN_BOTTOM : FL_ALIGN_TOP);
      }
    }

    // Check spacing and alignment between individual widgets
    if (drag && selection->is_widget()) {
      for (Fl_Type *q=next; q && q->level>level; q = q->next)
	if (q != selection && q->is_widget()) {
          Fl_Widget_Type *qw = (Fl_Widget_Type*)q;
          // Only check visible widgets...
	  if (!qw->o->visible_r()) continue;

          // Get bounding box of widget...
	  int qx = qw->o->x();
	  int qr = qw->o->x() + qw->o->w();
	  int qy = qw->o->y();
	  int qt = qw->o->y() + qw->o->h();

	  if (!(qw->o->align() & FL_ALIGN_INSIDE)) {
            // Adjust top/bottom for top/bottom labels...
	    int ww, hh;
	    ww = qw->o->w();
	    hh = qw->o->labelsize();
	    qw->o->measure_label(ww, hh);
	    if (qw->o->align() & FL_ALIGN_TOP) qy -= hh;
	    if (qw->o->align() & FL_ALIGN_BOTTOM) qt += hh;
	  }

          // Do horizontal alignment when the widget is within 25
	  // pixels vertically...
	  if (fl_min(abs(qy - mysel->o->y() - mysel->o->h()),
	             abs(mysel->o->y() - qt)) < 25) {
            // Align to left of other widget...
            if ((drag & (LEFT | DRAG)) && abs(d = mybx - qx) < 3) {
	      dx += d;
              mybx += d;
	      if (drag & DRAG) mybr += d;

	      draw_left_brace(qw->o);
	    }

            // Align to right of other widget...
            if ((drag & (RIGHT | DRAG)) &&
	        abs(d = qr - mybr) < 3) {
	      dx += d;
              if (drag & DRAG) mybx += d;
	      mybr += d;

	      draw_right_brace(qw->o);
	    }
          }

          // Align to top of other widget...
          if ((drag & (TOP | DRAG)) && abs(d = myby - qy) < 3) {
	    dy += d;
            myby += d;
	    if (drag & DRAG) mybt += d;

	    draw_top_brace(qw->o);
	  }

          // Align to bottom of other widget...
          if ((drag & (BOTTOM | DRAG)) && abs(d = qt - mybt) < 3) {
	    dy += d;
            if (drag & DRAG) myby += d;
	    mybt += d;

	    draw_bottom_brace(qw->o);
	  }

          // Check spacing between widgets
	  if (mysel->is_group()) mysel->ideal_spacing(xsp, ysp);
          else qw->ideal_spacing(xsp, ysp);

          if ((qt)>=myby && qy<=mybt) {
            if (drag & (LEFT | DRAG)) {
	      // Compare left of selected to left of current
	      if (abs(d = qx - mybx - xsp) >= 3)
	        d = qx - mybx + xsp;

	      if (abs(d) < 3) {
		dx += d;
        	mybx += d;
		if (drag & DRAG) mybr += d;

        	// Draw left arrow
		draw_h_arrow(mybx, (myby+mybt)/2, qx);
              }

	      // Compare left of selected to right of current
              if (abs(d = qr - mybx - xsp) >= 3)
	        d = qr - mybx + xsp;

	      if (abs(d) < 3) {
		dx += d;
        	mybx += d;
		if (drag & DRAG) mybr += d;

        	// Draw left arrow
		draw_h_arrow(mybx, (myby+mybt)/2, qr);
              }
	    }

            if (drag & (RIGHT | DRAG)) {
	      // Compare right of selected to left of current
	      if (abs(d = qx - mybr - xsp) >= 3)
	        d = qx - mybr + xsp;

	      if (abs(d) < 3) {
		dx += d;
        	if (drag & DRAG) mybx += d;
		mybr += d;

        	// Draw right arrow
		draw_h_arrow(mybr, (myby+mybt)/2, qx);
              }

	      // Compare right of selected to right of current
              if (abs(d = qr - mybr + xsp) >= 3)
	        d = qr - mybr - xsp;

              if (abs(d) < 3) {
		dx += d;
        	if (drag & DRAG) mybx += d;
		mybr += d;

        	// Draw right arrow
		draw_h_arrow(mybr, (myby+mybt)/2, qr);
              }
            }
	  }

          if (qr>=mybx && qx<=mybr) {
            // Compare top of selected to top of current
            if (drag & (TOP | DRAG)) {
	      if (abs(d = qy - myby - ysp) >= 3)
	        d = qy - myby + ysp;

	      if (abs(d) < 3) {
		dy += d;
		myby += d;
		if (drag & DRAG) mybt += d;

		// Draw up arrow...
		draw_v_arrow((mybx+mybr)/2, myby, qy);
              }

              // Compare top of selected to bottom of current
              if (abs(d = qt - myby - ysp) >= 3)
                d = qt - myby + ysp;

              if (abs(d) < 3) {
		dy += d;
		myby += d;
		if (drag & DRAG) mybt += d;

		// Draw up arrow...
		draw_v_arrow((mybx+mybr)/2, myby, qt);
              }
	    }

	    // Compare bottom of selected to top of current
            if (drag & (BOTTOM | DRAG)) {
	      if (abs(d = qy - mybt - ysp) >= 3)
	        d = qy - mybt + ysp;

	      if (abs(d) < 3) {
		dy += d;
		if (drag & DRAG) myby += d;
		mybt += d;

		// Draw down arrow...
		draw_v_arrow((mybx+mybr)/2, mybt, qy);
              }

	      // Compare bottom of selected to bottom of current
              if (abs(d = qt - mybt - ysp) >= 3)
                d = qt - mybt + ysp;

              if (abs(d) < 3) {
		dy += d;
		if (drag & DRAG) myby += d;
		mybt += d;

		// Draw down arrow...
		draw_v_arrow((mybx+mybr)/2, mybt, qt);
              }
	    }
          }
	}
    }
    mysx += mybx-mybx_bak; mysr += mybr-mybr_bak;
    mysy += myby-myby_bak; myst += mybt-mybt_bak;
  }
  // align the snapping selection box with the box we draw.
  sx = mysx; sy = mysy; sr = mysr; st = myst;

  // Draw selection box + resize handles...
  // draw box including all labels
  fl_line_style(FL_DOT);
  fl_rect(mybx,myby,mybr-mybx,mybt-myby);
  fl_line_style(FL_SOLID);
  // draw box excluding labels
  fl_rect(mysx,mysy,mysr-mysx,myst-mysy);
  fl_rectf(mysx,mysy,5,5);
  fl_rectf(mysr-5,mysy,5,5);
  fl_rectf(mysr-5,myst-5,5,5);
  fl_rectf(mysx,myst-5,5,5);
}